

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::isDebuggerActive(void)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  istream *piVar5;
  bool bVar6;
  string line;
  ifstream in;
  undefined1 *local_258;
  ulong local_250;
  undefined1 local_248 [16];
  long local_238 [65];
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  std::ifstream::ifstream((istream *)local_238,"/proc/self/status",_S_in);
  local_250 = 0;
  local_248[0] = 0;
  local_258 = local_248;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_258,cVar2);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) goto LAB_0015cf24;
    iVar3 = std::__cxx11::string::compare((ulong)&local_258,0,(char *)0xb);
  } while (iVar3 != 0);
  if (local_250 < 0xc) {
LAB_0015cf24:
    bVar6 = false;
  }
  else {
    bVar6 = local_258[0xb] != '0';
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  std::ifstream::~ifstream(local_238);
  *piVar4 = iVar1;
  return bVar6;
}

Assistant:

ErrnoGuard::~ErrnoGuard() { errno = m_oldErrno; }